

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O2

int gdImageSelectiveBlur(gdImagePtr src)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int color;
  gdImagePtr dst;
  code *pcVar4;
  float (*pafVar5) [3];
  float (*pafVar6) [3];
  float (*pafVar7) [3];
  int iVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int b;
  uint uVar12;
  uint uVar13;
  uint a;
  int g;
  long lVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float (*local_110) [3];
  float (*local_108) [3];
  float (*local_d0) [3];
  float flt_b [3] [3];
  float flt_g [3] [3];
  float flt_r [3] [3];
  
  iVar11 = 0;
  if ((src != (gdImagePtr)0x0) &&
     (dst = gdImageCreateTrueColor(src->sx,src->sy), dst != (gdImagePtr)0x0)) {
    a = 0;
    gdImageCopy(dst,src,0,0,0,0,src->sx,src->sy);
    if (src->trueColor == 0) {
      pcVar4 = gdImageGetPixel;
    }
    else {
      pcVar4 = gdImageGetTrueColorPixel;
    }
    for (uVar10 = 0; (long)uVar10 < (long)src->sy; uVar10 = uVar10 + 1) {
      iVar1 = (int)uVar10 + -1;
      iVar11 = -1;
      for (uVar15 = 0; (long)uVar15 < (long)src->sx; uVar15 = uVar15 + 1) {
        uVar2 = (*pcVar4)(src,uVar15 & 0xffffffff,uVar10 & 0xffffffff);
        fVar20 = 0.0;
        local_110 = flt_b;
        local_108 = flt_r;
        local_d0 = flt_g;
        fVar21 = 0.0;
        fVar22 = 0.0;
        for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
          for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
            if (lVar14 == 1 && lVar9 == 1) {
              flt_b[1][1] = 0.5;
              flt_g[1][1] = 0.5;
              flt_r[1][1] = 0.5;
              fVar16 = 0.5;
              fVar18 = 0.5;
              fVar17 = 0.5;
            }
            else {
              uVar3 = (*pcVar4)(src,iVar11 + (int)lVar14,iVar1 + (int)lVar9);
              iVar8 = dst->trueColor;
              if (iVar8 == 0) {
                a = dst->alpha[(int)uVar3];
                uVar13 = dst->red[(int)uVar2];
                uVar12 = dst->red[(int)uVar3];
              }
              else {
                a = uVar3 >> 0x18 & 0x7f;
                uVar12 = uVar3 >> 0x10 & 0xff;
                uVar13 = uVar2 >> 0x10 & 0xff;
              }
              fVar17 = (float)(int)uVar13 - (float)(int)uVar12;
              fVar16 = 1.0;
              if ((fVar17 != 0.0) || (NAN(fVar17))) {
                fVar16 = -fVar17;
                if (-fVar17 <= fVar17) {
                  fVar16 = fVar17;
                }
                fVar16 = 1.0 / fVar16;
              }
              (*local_108)[lVar14] = fVar16;
              if (iVar8 == 0) {
                uVar13 = dst->green[(int)uVar2];
                uVar12 = dst->green[(int)uVar3];
              }
              else {
                uVar12 = uVar3 >> 8 & 0xff;
                uVar13 = uVar2 >> 8 & 0xff;
              }
              fVar19 = (float)(int)uVar13 - (float)(int)uVar12;
              fVar17 = 1.0;
              if ((fVar19 != 0.0) || (NAN(fVar19))) {
                fVar17 = -fVar19;
                if (-fVar19 <= fVar19) {
                  fVar17 = fVar19;
                }
                fVar17 = 1.0 / fVar17;
              }
              (*local_d0)[lVar14] = fVar17;
              if (iVar8 == 0) {
                uVar13 = dst->blue[(int)uVar2];
                uVar3 = dst->blue[(int)uVar3];
              }
              else {
                uVar3 = uVar3 & 0xff;
                uVar13 = uVar2 & 0xff;
              }
              fVar19 = (float)(int)uVar13 - (float)(int)uVar3;
              if ((fVar19 != 0.0) || (NAN(fVar19))) {
                fVar18 = -fVar19;
                if (-fVar19 <= fVar19) {
                  fVar18 = fVar19;
                }
                fVar18 = 1.0 / fVar18;
                (*local_110)[lVar14] = fVar18;
              }
              else {
                (*local_110)[lVar14] = 1.0;
                fVar18 = 1.0;
              }
            }
            fVar20 = fVar20 + fVar16;
            fVar21 = fVar21 + fVar17;
            fVar22 = fVar22 + fVar18;
          }
          local_d0 = local_d0 + 1;
          local_108 = local_108 + 1;
          local_110 = local_110 + 1;
        }
        pafVar5 = flt_r;
        pafVar6 = flt_g;
        pafVar7 = flt_b;
        for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
          for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
            if ((fVar20 != 0.0) || (NAN(fVar20))) {
              (*pafVar5)[lVar14] = (*pafVar5)[lVar14] / fVar20;
            }
            if ((fVar21 != 0.0) || (NAN(fVar21))) {
              (*pafVar6)[lVar14] = (*pafVar6)[lVar14] / fVar21;
            }
            if ((fVar22 != 0.0) || (NAN(fVar22))) {
              (*pafVar7)[lVar14] = (*pafVar7)[lVar14] / fVar22;
            }
          }
          pafVar7 = pafVar7 + 1;
          pafVar6 = pafVar6 + 1;
          pafVar5 = pafVar5 + 1;
        }
        fVar22 = 0.0;
        pafVar7 = flt_b;
        pafVar5 = flt_g;
        pafVar6 = flt_r;
        fVar21 = 0.0;
        fVar20 = 0.0;
        for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
          for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
            uVar2 = (*pcVar4)(src,iVar11 + (int)lVar14,iVar1 + (int)lVar9);
            iVar8 = dst->trueColor;
            if (iVar8 == 0) {
              uVar3 = dst->red[(int)uVar2];
            }
            else {
              uVar3 = uVar2 >> 0x10 & 0xff;
            }
            if (iVar8 == 0) {
              uVar13 = dst->green[(int)uVar2];
            }
            else {
              uVar13 = uVar2 >> 8 & 0xff;
            }
            if (iVar8 == 0) {
              uVar2 = dst->blue[(int)uVar2];
            }
            else {
              uVar2 = uVar2 & 0xff;
            }
            fVar22 = fVar22 + (float)(int)uVar3 * (*pafVar6)[lVar14];
            fVar21 = fVar21 + (float)(int)uVar13 * (*pafVar5)[lVar14];
            fVar20 = fVar20 + (float)(int)uVar2 * (*pafVar7)[lVar14];
          }
          pafVar6 = pafVar6 + 1;
          pafVar5 = pafVar5 + 1;
          pafVar7 = pafVar7 + 1;
        }
        g = 0xff;
        iVar8 = 0xff;
        if (fVar22 <= 255.0) {
          fVar16 = 0.0;
          if (0.0 <= fVar22) {
            fVar16 = fVar22;
          }
          iVar8 = (int)fVar16;
        }
        if (fVar21 <= 255.0) {
          fVar22 = 0.0;
          if (0.0 <= fVar21) {
            fVar22 = fVar21;
          }
          g = (int)fVar22;
        }
        b = 0xff;
        if (fVar20 <= 255.0) {
          fVar21 = 0.0;
          if (0.0 <= fVar20) {
            fVar21 = fVar20;
          }
          b = (int)fVar21;
        }
        color = gdImageColorAllocateAlpha(src,iVar8,g,b,a);
        if (color == -1) {
          color = gdImageColorClosestAlpha(src,iVar8,g,b,a);
        }
        gdImageSetPixel(src,(int)uVar15,(int)uVar10,color);
        iVar11 = iVar11 + 1;
      }
    }
    gdImageDestroy(dst);
    iVar11 = 1;
  }
  return iVar11;
}

Assistant:

BGD_DECLARE(int) gdImageSelectiveBlur( gdImagePtr src)
{
	int         x, y, i, j;
	float       new_r, new_g, new_b;
	int         new_pxl, cpxl, pxl, new_a=0;
	float flt_r [3][3];
	float flt_g [3][3];
	float flt_b [3][3];
	float flt_r_sum, flt_g_sum, flt_b_sum;

	gdImagePtr srcback;
	FuncPtr f;

	if (src==NULL) {
		return 0;
	}

	/* We need the orinal image with each safe neoghb. pixel */
	srcback = gdImageCreateTrueColor (src->sx, src->sy);
	if (srcback==NULL) {
		return 0;
	}
	gdImageCopy(srcback, src,0,0,0,0,src->sx,src->sy);

	f = GET_PIXEL_FUNCTION(src);

	for(y = 0; y<src->sy; y++) {
		for (x=0; x<src->sx; x++) {
		      flt_r_sum = flt_g_sum = flt_b_sum = 0.0;
			cpxl = f(src, x, y);

			for (j=0; j<3; j++) {
				for (i=0; i<3; i++) {
					if ((j == 1) && (i == 1)) {
						flt_r[1][1] = flt_g[1][1] = flt_b[1][1] = 0.5;
					} else {
						pxl = f(src, x-(3>>1)+i, y-(3>>1)+j);
						new_a = gdImageAlpha(srcback, pxl);

						new_r = ((float)gdImageRed(srcback, cpxl)) - ((float)gdImageRed (srcback, pxl));

						if (new_r < 0.0f) {
							new_r = -new_r;
						}
						if (new_r != 0) {
							flt_r[j][i] = 1.0f/new_r;
						} else {
							flt_r[j][i] = 1.0f;
						}

						new_g = ((float)gdImageGreen(srcback, cpxl)) - ((float)gdImageGreen(srcback, pxl));

						if (new_g < 0.0f) {
							new_g = -new_g;
						}
						if (new_g != 0) {
							flt_g[j][i] = 1.0f/new_g;
						} else {
							flt_g[j][i] = 1.0f;
						}

						new_b = ((float)gdImageBlue(srcback, cpxl)) - ((float)gdImageBlue(srcback, pxl));

						if (new_b < 0.0f) {
							new_b = -new_b;
						}
						if (new_b != 0) {
							flt_b[j][i] = 1.0f/new_b;
						} else {
							flt_b[j][i] = 1.0f;
						}
					}

					flt_r_sum += flt_r[j][i];
					flt_g_sum += flt_g[j][i];
					flt_b_sum += flt_b [j][i];
				}
			}

			for (j=0; j<3; j++) {
				for (i=0; i<3; i++) {
					if (flt_r_sum != 0.0) {
						flt_r[j][i] /= flt_r_sum;
					}
					if (flt_g_sum != 0.0) {
						flt_g[j][i] /= flt_g_sum;
					}
					if (flt_b_sum != 0.0) {
						flt_b [j][i] /= flt_b_sum;
					}
				}
			}

			new_r = new_g = new_b = 0.0;

			for (j=0; j<3; j++) {
				for (i=0; i<3; i++) {
					pxl = f(src, x-(3>>1)+i, y-(3>>1)+j);
					new_r += (float)gdImageRed(srcback, pxl) * flt_r[j][i];
					new_g += (float)gdImageGreen(srcback, pxl) * flt_g[j][i];
					new_b += (float)gdImageBlue(srcback, pxl) * flt_b[j][i];
				}
			}

			new_r = (new_r > 255.0f)? 255.0f : ((new_r < 0.0f)? 0.0f:new_r);
			new_g = (new_g > 255.0f)? 255.0f : ((new_g < 0.0f)? 0.0f:new_g);
			new_b = (new_b > 255.0f)? 255.0f : ((new_b < 0.0f)? 0.0f:new_b);
			new_pxl = gdImageColorAllocateAlpha(src, (int)new_r, (int)new_g, (int)new_b, new_a);
			if (new_pxl == -1) {
				new_pxl = gdImageColorClosestAlpha(src, (int)new_r, (int)new_g, (int)new_b, new_a);
			}
			gdImageSetPixel (src, x, y, new_pxl);
		}
	}
	gdImageDestroy(srcback);
	return 1;
}